

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_conn.c
# Opt level: O1

ares_status_t ares_conn_connect(ares_conn_t *conn,sockaddr *sa,ares_socklen_t salen)

{
  ares_conn_err_t aVar1;
  ares_status_t aVar2;
  
  aVar1 = ares_socket_connect(conn->server->channel,conn->fd,conn->flags >> 1 & ARES_TRUE,sa,salen);
  aVar2 = ARES_ECONNREFUSED;
  if (aVar1 < ARES_CONN_ERR_CONNCLOSED) {
    aVar2 = ARES_SUCCESS;
  }
  return aVar2;
}

Assistant:

static ares_status_t ares_conn_connect(ares_conn_t           *conn,
                                       const struct sockaddr *sa,
                                       ares_socklen_t         salen)
{
  ares_conn_err_t err;

  err = ares_socket_connect(
    conn->server->channel, conn->fd,
    (conn->flags & ARES_CONN_FLAG_TFO) ? ARES_TRUE : ARES_FALSE, sa, salen);

  if (err != ARES_CONN_ERR_WOULDBLOCK && err != ARES_CONN_ERR_SUCCESS) {
    return ARES_ECONNREFUSED;
  }
  return ARES_SUCCESS;
}